

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::PositionColorShader::shadeVertices
          (PositionColorShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  Vector<float,_4> local_58;
  undefined8 local_48;
  undefined8 local_40;
  VertexPacket *local_38;
  VertexPacket *packet;
  int colorAttrLoc;
  int positionAttrLoc;
  int packetNdx;
  int numPackets_local;
  VertexPacket **packets_local;
  VertexAttrib *inputs_local;
  PositionColorShader *this_local;
  
  positionAttrLoc = numPackets;
  _packetNdx = packets;
  packets_local = (VertexPacket **)inputs;
  inputs_local = (VertexAttrib *)this;
  for (colorAttrLoc = 0; colorAttrLoc < positionAttrLoc; colorAttrLoc = colorAttrLoc + 1) {
    packet._4_4_ = 0;
    packet._0_4_ = 1;
    local_38 = _packetNdx[colorAttrLoc];
    rr::readVertexAttribFloat
              ((rr *)&local_48,(VertexAttrib *)packets_local,local_38->instanceNdx,
               local_38->vertexNdx);
    *(undefined8 *)(local_38->position).m_data = local_48;
    *(undefined8 *)((local_38->position).m_data + 2) = local_40;
    rr::readVertexAttribFloat
              ((rr *)&local_58,(VertexAttrib *)(packets_local + 5),local_38->instanceNdx,
               local_38->vertexNdx);
    rr::GenericVec4::operator=(local_38->outputs,&local_58);
  }
  return;
}

Assistant:

void PositionColorShader::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const int positionAttrLoc = 0;
		const int colorAttrLoc = 1;

		rr::VertexPacket& packet = *packets[packetNdx];

		// Transform to position
		packet.position = rr::readVertexAttribFloat(inputs[positionAttrLoc], packet.instanceNdx, packet.vertexNdx);

		// Pass color to FS
		packet.outputs[VARYINGLOC_COLOR] = rr::readVertexAttribFloat(inputs[colorAttrLoc], packet.instanceNdx, packet.vertexNdx);
	}
}